

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_fnmatch.c
# Opt level: O3

int loop(uchar *pattern,uchar *string)

{
  ushort *puVar1;
  bool bVar2;
  undefined1 auVar3 [4];
  short sVar4;
  byte bVar5;
  ushort uVar7;
  int iVar8;
  uint uVar9;
  ushort **ppuVar10;
  ulong uVar11;
  char *pcVar12;
  ushort uVar13;
  long lVar14;
  byte bVar15;
  ulong uVar16;
  byte *pbVar17;
  ulong uVar18;
  bool bVar19;
  uchar charset [271];
  undefined1 local_160 [4];
  short sStack_15c;
  undefined2 local_158;
  undefined4 local_154;
  undefined8 local_150;
  char local_148 [257];
  char local_47 [23];
  char cVar6;
  
  memset(local_148,0,0x10f);
  do {
    bVar15 = *pattern;
    if (bVar15 < 0x5b) {
      pbVar17 = pattern;
      if (bVar15 == 0x2a) {
        do {
          pattern = pbVar17;
          pbVar17 = pattern + 1;
        } while (pattern[1] == 0x2a);
        bVar15 = *string;
        if (pattern[1] == 0 && bVar15 == 0) {
          return 0;
        }
        iVar8 = loop(pattern + 1,string);
        if ((bVar15 == 0) || (iVar8 == 0)) {
          bVar19 = iVar8 == 0;
LAB_00135b55:
          return (uint)!bVar19;
        }
      }
      else {
        if (bVar15 == 0x3f) {
          ppuVar10 = __ctype_b_loc();
          if ((*(byte *)((long)*ppuVar10 + (ulong)*string * 2 + 1) & 0x40) == 0) {
            return 2 - (uint)(*string == 0);
          }
        }
        else {
          if (bVar15 == 0) {
            bVar19 = *string == 0;
            goto LAB_00135b55;
          }
LAB_00135989:
          if (bVar15 != *string) {
            return 1;
          }
        }
        pattern = pattern + 1;
      }
    }
    else {
      if (bVar15 == 0x5b) {
        pbVar17 = pattern + 1;
        uVar9 = 0;
        local_154 = 0;
        bVar19 = false;
        uVar11 = 0;
        local_150 = string;
LAB_0013549b:
        do {
        } while (4 < uVar9);
        bVar15 = *pbVar17;
        uVar16 = (ulong)bVar15;
        uVar18 = (ulong)bVar15;
        switch(uVar9) {
        case 0:
          ppuVar10 = __ctype_b_loc();
          puVar1 = *ppuVar10;
          if ((puVar1[uVar18] & 8) != 0) {
            local_148[uVar18] = '\x01';
            pbVar17 = pbVar17 + 1;
            bVar19 = true;
            uVar9 = 1;
            uVar11 = uVar16;
            goto LAB_0013549b;
          }
          if (0x3e < bVar15) {
            switch(bVar15) {
            case 0x5b:
              if (pbVar17[1] == 0x3a) {
                local_158 = 0;
                _local_160 = 0;
                pbVar17 = pbVar17 + 3;
                bVar19 = false;
                lVar14 = 0;
                while (bVar15 = pbVar17[-1], !bVar19) {
                  if ((~puVar1[bVar15] & 0x600) == 0) {
                    local_160[lVar14] = bVar15;
                    bVar19 = false;
                  }
                  else {
                    bVar19 = true;
                    if (bVar15 != 0x3a) {
                      return 2;
                    }
                  }
                  lVar14 = lVar14 + 1;
                  pbVar17 = pbVar17 + 1;
                  if (lVar14 == 10) {
                    return 2;
                  }
                }
                if (bVar15 != 0x5d) {
                  return 2;
                }
                auVar3 = local_160;
                sVar4 = sStack_15c;
                pcVar12 = local_47 + 1;
                if (((sStack_15c != 0x74 || local_160 != (undefined1  [4])0x69676964) &&
                    (pcVar12 = local_47,
                    sStack_15c != 0x6d || local_160 != (undefined1  [4])0x756e6c61)) &&
                   (pcVar12 = local_47 + 3,
                   sStack_15c != 0x61 || local_160 != (undefined1  [4])0x68706c61)) {
                  pcVar12 = local_47 + 2;
                  if ((((stack0xfffffffffffffea3 != 0x746967 ||
                         auVar3 != (undefined1  [4])0x67696478) &&
                       (pcVar12 = local_47 + 4,
                       sVar4 != 0x74 || auVar3 != (undefined1  [4])0x6e697270)) &&
                      (((pcVar12 = local_47 + 7,
                        sVar4 != 0x68 || auVar3 != (undefined1  [4])0x70617267 &&
                        ((pcVar12 = local_47 + 8,
                         sVar4 != 0x65 || auVar3 != (undefined1  [4])0x63617073 &&
                         (pcVar12 = local_47 + 5,
                         sVar4 != 0x6b || auVar3 != (undefined1  [4])0x6e616c62)))) &&
                       (pcVar12 = local_47 + 9,
                       sVar4 != 0x72 || auVar3 != (undefined1  [4])0x65707075)))) &&
                     (pcVar12 = local_47 + 6, sVar4 != 0x72 || auVar3 != (undefined1  [4])0x65776f6c
                     )) {
                    return 2;
                  }
                }
                *pcVar12 = '\x01';
              }
              else {
                pbVar17 = pbVar17 + 1;
                local_148[uVar18] = '\x01';
              }
              goto LAB_001357b5;
            case 0x5c:
              uVar11 = (ulong)pbVar17[1];
              if ((*(byte *)((long)puVar1 + uVar11 * 2 + 1) & 0x40) == 0) {
                return 2;
              }
              local_148[uVar11] = '\x01';
              pbVar17 = pbVar17 + 2;
              bVar19 = true;
              uVar9 = 1;
              goto LAB_0013549b;
            case 0x5d:
              if (bVar19) goto LAB_001359a7;
              local_148[uVar18] = '\x01';
              pbVar17 = pbVar17 + 1;
              bVar19 = true;
              uVar9 = 3;
              goto LAB_0013549b;
            case 0x5e:
              goto switchD_001354ef_caseD_5e;
            default:
              goto switchD_001354ef_default;
            }
          }
          if (bVar15 != 0x21) {
            if ((bVar15 != 0x2a) && (bVar15 == 0)) {
              return 2;
            }
switchD_001354ef_default:
            local_148[uVar18] = '\x01';
            pbVar17 = pbVar17 + 1;
LAB_001357b5:
            bVar19 = true;
            uVar9 = 0;
            goto LAB_0013549b;
          }
switchD_001354ef_caseD_5e:
          pcVar12 = local_148 + uVar18;
          if (local_148[0x100] == '\0') {
            pcVar12 = local_148 + 0x100;
          }
          bVar2 = true;
          if (local_148[0x100] == '\0') {
            bVar2 = bVar19;
          }
          if (bVar19) {
            pcVar12 = local_148 + uVar18;
            bVar2 = bVar19;
          }
          *pcVar12 = '\x01';
          bVar19 = bVar2;
          break;
        case 1:
          uVar9 = 0;
          if (bVar15 == 0x5b) goto LAB_0013549b;
          if (bVar15 == 0x2d) {
            local_148[0x2d] = 1;
            pbVar17 = pbVar17 + 1;
            local_154 = 0x2d;
            uVar9 = 2;
            goto LAB_0013549b;
          }
          ppuVar10 = __ctype_b_loc();
          if (((*ppuVar10)[uVar18] & 8) != 0) {
            local_148[uVar18] = '\x01';
            pbVar17 = pbVar17 + 1;
            uVar9 = 1;
            goto LAB_0013549b;
          }
          if (bVar15 == 0x5c) {
            if ((*(byte *)((long)*ppuVar10 + (ulong)pbVar17[1] * 2 + 1) & 0x40) == 0) {
              return 2;
            }
            local_148[pbVar17[1]] = '\x01';
            pbVar17 = pbVar17 + 2;
            uVar9 = 1;
            goto LAB_0013549b;
          }
          if (bVar15 != 0x5d) {
            return 2;
          }
LAB_001359a7:
          uVar11 = (ulong)*local_150;
          uVar7 = 1;
          if (local_148[uVar11] == '\0') {
            if (local_47[0] == '\0') {
              if (local_47[3] == '\0') {
                if (local_47[1] == '\0') {
                  if (local_47[2] == '\0') {
                    if (local_47[4] == '\0') {
                      if (local_47[8] == '\0') {
                        if (local_47[9] == '\0') {
                          if (local_47[6] == '\0') {
                            if (local_47[5] == '\0') {
                              if (local_47[7] == '\0') {
                                uVar7 = 0;
                              }
                              else {
                                ppuVar10 = __ctype_b_loc();
                                uVar7 = (*ppuVar10)[uVar11] & 0x8000;
                              }
                            }
                            else {
                              uVar7 = (ushort)(uVar11 == 9 || uVar11 == 0x20);
                            }
                          }
                          else {
                            ppuVar10 = __ctype_b_loc();
                            uVar7 = (*ppuVar10)[uVar11] & 0x200;
                          }
                        }
                        else {
                          ppuVar10 = __ctype_b_loc();
                          uVar7 = (*ppuVar10)[uVar11] & 0x100;
                        }
                      }
                      else {
                        ppuVar10 = __ctype_b_loc();
                        uVar7 = (*ppuVar10)[uVar11] & 0x2000;
                      }
                    }
                    else {
                      ppuVar10 = __ctype_b_loc();
                      uVar7 = (*ppuVar10)[uVar11] & 0x4000;
                    }
                  }
                  else {
                    ppuVar10 = __ctype_b_loc();
                    uVar7 = (*ppuVar10)[uVar11] & 0x1000;
                  }
                }
                else {
                  ppuVar10 = __ctype_b_loc();
                  uVar7 = (*ppuVar10)[uVar11] & 0x800;
                }
              }
              else {
                ppuVar10 = __ctype_b_loc();
                uVar7 = (*ppuVar10)[uVar11] & 0x400;
              }
            }
            else {
              ppuVar10 = __ctype_b_loc();
              uVar7 = (*ppuVar10)[uVar11] & 8;
            }
          }
          uVar13 = (ushort)(uVar7 == 0);
          if (local_148[0x100] == '\0') {
            uVar13 = uVar7;
          }
          if (uVar13 == 0) {
            return 1;
          }
          pattern = pbVar17 + 1;
          memset(local_148,0,0x10f);
          string = local_150;
          goto LAB_00135995;
        case 2:
          if (bVar15 == 0x5c) {
            uVar16 = (ulong)pbVar17[1];
            ppuVar10 = __ctype_b_loc();
            if ((*(byte *)((long)*ppuVar10 + uVar16 * 2 + 1) & 0x40) == 0) {
              return 2;
            }
            pbVar17 = pbVar17 + 1;
          }
          if ((char)uVar16 == '\\') {
            uVar16 = (ulong)pbVar17[1];
            ppuVar10 = __ctype_b_loc();
            if ((*(byte *)((long)*ppuVar10 + uVar16 * 2 + 1) & 0x40) == 0) {
              return 2;
            }
            local_148[uVar16] = '\x01';
            pbVar17 = pbVar17 + 2;
            uVar9 = 0;
          }
          else {
            uVar9 = 2;
            if ((int)uVar16 == 0x5d) goto LAB_001359a7;
          }
          bVar15 = (byte)uVar16;
          if (bVar15 < (byte)uVar11) goto LAB_0013549b;
          ppuVar10 = __ctype_b_loc();
          puVar1 = *ppuVar10;
          uVar7 = puVar1[uVar16];
          if ((((uVar7 >> 9 & 1) == 0) || ((*(byte *)((long)puVar1 + uVar11 * 2 + 1) & 2) == 0)) &&
             (((uVar7 >> 0xb & 1) == 0 || ((*(byte *)((long)puVar1 + uVar11 * 2 + 1) & 8) == 0)))) {
            if ((uVar7 >> 8 & 1) == 0) {
              return 2;
            }
            if ((*(byte *)((long)puVar1 + uVar11 * 2 + 1) & 1) == 0) {
              return 2;
            }
          }
          local_148[(byte)local_154] = '\0';
          uVar9 = (int)uVar11 + 1;
          if (bVar15 < (byte)uVar9) {
            uVar11 = (ulong)(byte)((byte)uVar11 + 2);
          }
          else {
            do {
              cVar6 = (char)uVar9;
              bVar5 = cVar6 + 1;
              uVar9 = (uint)bVar5;
              local_148[(ulong)bVar5 - 1] = '\x01';
            } while (bVar5 <= bVar15);
            uVar11 = (ulong)(byte)(cVar6 + 2);
          }
          break;
        case 3:
          if (bVar15 == 0x5b) goto LAB_001356e3;
          if (bVar15 == 0) {
            return 2;
          }
          if (bVar15 != 0x5d) {
            ppuVar10 = __ctype_b_loc();
            if ((*(byte *)((long)*ppuVar10 + uVar18 * 2 + 1) & 0x40) == 0) {
              return 2;
            }
            goto LAB_001355df;
          }
          goto LAB_001359a7;
        case 4:
          if (bVar15 == 0x5d) goto LAB_001359a7;
LAB_001355df:
          local_148[uVar18] = '\x01';
        }
        pbVar17 = pbVar17 + 1;
        uVar9 = 0;
        goto LAB_0013549b;
      }
      if (bVar15 != 0x5c) goto LAB_00135989;
      ppuVar10 = __ctype_b_loc();
      if ((*(byte *)((long)*ppuVar10 + (ulong)pattern[1] * 2 + 1) & 0x40) == 0) {
        return 2;
      }
      if (pattern[1] != *string) {
        return 1;
      }
      pattern = pattern + 2;
    }
LAB_00135995:
    string = string + 1;
  } while( true );
LAB_001356e3:
  local_148[0x5b] = 1;
  pbVar17 = pbVar17 + 1;
  uVar9 = 4;
  goto LAB_0013549b;
}

Assistant:

static int loop(const unsigned char *pattern, const unsigned char *string)
{
  loop_state state = CURLFNM_LOOP_DEFAULT;
  unsigned char *p = (unsigned char *)pattern;
  unsigned char *s = (unsigned char *)string;
  unsigned char charset[CURLFNM_CHSET_SIZE] = { 0 };
  int rc = 0;

  for(;;) {
    switch(state) {
    case CURLFNM_LOOP_DEFAULT:
      if(*p == '*') {
        while(*(p+1) == '*') /* eliminate multiple stars */
          p++;
        if(*s == '\0' && *(p+1) == '\0')
          return CURL_FNMATCH_MATCH;
        rc = loop(p + 1, s); /* *.txt matches .txt <=> .txt matches .txt */
        if(rc == CURL_FNMATCH_MATCH)
          return CURL_FNMATCH_MATCH;
        if(*s) /* let the star eat up one character */
          s++;
        else
          return CURL_FNMATCH_NOMATCH;
      }
      else if(*p == '?') {
        if(ISPRINT(*s)) {
          s++;
          p++;
        }
        else if(*s == '\0')
          return CURL_FNMATCH_NOMATCH;
        else
          return CURL_FNMATCH_FAIL; /* cannot deal with other character */
      }
      else if(*p == '\0') {
        if(*s == '\0')
          return CURL_FNMATCH_MATCH;
        else
          return CURL_FNMATCH_NOMATCH;
      }
      else if(*p == '\\') {
        state = CURLFNM_LOOP_BACKSLASH;
        p++;
      }
      else if(*p == '[') {
        unsigned char *pp = p+1; /* cannot handle with pointer to register */
        if(setcharset(&pp, charset)) {
          int found = FALSE;
          if(charset[(unsigned int)*s])
            found = TRUE;
          else if(charset[CURLFNM_ALNUM])
            found = ISALNUM(*s);
          else if(charset[CURLFNM_ALPHA])
            found = ISALPHA(*s);
          else if(charset[CURLFNM_DIGIT])
            found = ISDIGIT(*s);
          else if(charset[CURLFNM_XDIGIT])
            found = ISXDIGIT(*s);
          else if(charset[CURLFNM_PRINT])
            found = ISPRINT(*s);
          else if(charset[CURLFNM_SPACE])
            found = ISSPACE(*s);
          else if(charset[CURLFNM_UPPER])
            found = ISUPPER(*s);
          else if(charset[CURLFNM_LOWER])
            found = ISLOWER(*s);
          else if(charset[CURLFNM_BLANK])
            found = ISBLANK(*s);
          else if(charset[CURLFNM_GRAPH])
            found = ISGRAPH(*s);

          if(charset[CURLFNM_NEGATE])
            found = !found;

          if(found) {
            p = pp+1;
            s++;
            memset(charset, 0, CURLFNM_CHSET_SIZE);
          }
          else
            return CURL_FNMATCH_NOMATCH;
        }
        else
          return CURL_FNMATCH_FAIL;
      }
      else {
        if(*p++ != *s++)
          return CURL_FNMATCH_NOMATCH;
      }
      break;
    case CURLFNM_LOOP_BACKSLASH:
      if(ISPRINT(*p)) {
        if(*p++ == *s++)
          state = CURLFNM_LOOP_DEFAULT;
        else
          return CURL_FNMATCH_NOMATCH;
      }
      else
        return CURL_FNMATCH_FAIL;
      break;
    }
  }
}